

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setAttribute
          (GLShaderProgram *this,string *name,
          shared_ptr<polyscope::render::AttributeBuffer> *externalBuffer)

{
  pointer pGVar1;
  pointer pGVar2;
  size_t __n;
  element_type *peVar3;
  int iVar4;
  invalid_argument *piVar5;
  long *plVar6;
  size_type *psVar7;
  GLShaderProgram *this_00;
  polyscope *this_01;
  bool bVar8;
  bool bVar9;
  shared_ptr<polyscope::render::backend_openGL_mock::GLAttributeBuffer> engineExtBuff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  RenderDataType local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pGVar1 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (this->attributes).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderAttribute,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderAttribute>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar8 = pGVar1 == pGVar2;
  if (!bVar8) {
    this_01 = (polyscope *)&pGVar1->type;
    do {
      __n = *(size_t *)(this_01 + -0x18);
      if (__n == name->_M_string_length) {
        if (__n == 0) {
          bVar9 = true;
        }
        else {
          iVar4 = bcmp((((GLShaderAttribute *)(this_01 + -0x20))->name)._M_dataplus._M_p,
                       (name->_M_dataplus)._M_p,__n);
          bVar9 = iVar4 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        iVar4 = renderDataTypeCountCompatbility
                          (*(RenderDataType *)this_01,
                           ((externalBuffer->
                            super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr)->dataType);
        if (iVar4 == 0) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_50,"Tried to set attribute ",name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_b0._M_dataplus._M_p = (pointer)*plVar6;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_b0._M_dataplus._M_p == psVar7) {
            local_b0.field_2._M_allocated_capacity = *psVar7;
            local_b0.field_2._8_8_ = plVar6[3];
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          }
          else {
            local_b0.field_2._M_allocated_capacity = *psVar7;
          }
          local_b0._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          renderDataTypeName_abi_cxx11_
                    (&local_70,this_01,(RenderDataType *)local_b0._M_string_length);
          std::operator+(&local_d8,&local_b0,&local_70);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_f8._M_dataplus._M_p = (pointer)*plVar6;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_f8._M_dataplus._M_p == psVar7) {
            local_f8.field_2._M_allocated_capacity = *psVar7;
            local_f8.field_2._8_8_ = plVar6[3];
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar7;
          }
          local_f8._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          local_b4 = ((externalBuffer->
                      super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)->dataType;
          renderDataTypeName_abi_cxx11_
                    (&local_90,(polyscope *)&local_b4,(RenderDataType *)local_f8._M_string_length);
          std::operator+(&local_118,&local_f8,&local_90);
          std::invalid_argument::invalid_argument(piVar5,(string *)&local_118);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        if (*(long *)(this_01 + 8) != 0) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_f8,"attribute ",name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_118._M_dataplus._M_p = (pointer)*plVar6;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_118._M_dataplus._M_p == psVar7) {
            local_118.field_2._M_allocated_capacity = *psVar7;
            local_118.field_2._8_8_ = plVar6[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar7;
          }
          local_118._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar5,(string *)&local_118);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        peVar3 = (externalBuffer->
                 super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr;
        if (peVar3 == (element_type *)0x0) {
          local_d8._M_dataplus._M_p = (pointer)0x0;
        }
        else {
          local_d8._M_dataplus._M_p =
               (pointer)__dynamic_cast(peVar3,&AttributeBuffer::typeinfo,
                                       &GLAttributeBuffer::typeinfo,0);
        }
        if (local_d8._M_dataplus._M_p == (pointer)0x0) {
          local_d8._M_dataplus._M_p = (pointer)0x0;
          local_d8._M_string_length = 0;
        }
        else {
          local_d8._M_string_length =
               (size_type)
               (externalBuffer->
               super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_d8._M_string_length)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_d8._M_string_length)->_M_use_count + 1;
            }
          }
        }
        if (local_d8._M_dataplus._M_p == (pointer)0x0) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_f8,"attribute ",name);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_118._M_dataplus._M_p = (pointer)*plVar6;
          psVar7 = (size_type *)(plVar6 + 2);
          if ((size_type *)local_118._M_dataplus._M_p == psVar7) {
            local_118.field_2._M_allocated_capacity = *psVar7;
            local_118.field_2._8_8_ = plVar6[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar7;
          }
          local_118._M_string_length = plVar6[1];
          *plVar6 = (long)psVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar5,(string *)&local_118);
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        *(pointer *)(this_01 + 8) = local_d8._M_dataplus._M_p;
        this_00 = (GLShaderProgram *)(this_01 + 0x10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
        assignBufferToVAO(this_00,(GLShaderAttribute *)(this_01 + -0x20));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
        }
        if (bVar9) {
          if (!bVar8) {
            return;
          }
          break;
        }
      }
      bVar8 = (pointer)(this_01 + 0x18) == pGVar2;
      this_01 = this_01 + 0x38;
    } while (!bVar8);
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_118,"Tried to set nonexistent attribute with name ",name);
  std::invalid_argument::invalid_argument(piVar5,(string *)&local_118);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setAttribute(std::string name, std::shared_ptr<AttributeBuffer> externalBuffer) {
  bindVAO();
  checkGLError();

  for (GLShaderAttribute& a : attributes) {
    if (a.name == name) {

      // check that types match
      int compatCount = renderDataTypeCountCompatbility(a.type, externalBuffer->getType());
      if (compatCount == 0)
        throw std::invalid_argument("Tried to set attribute " + name + " to incompatibile type. Attribute " +
                                    renderDataTypeName(a.type) + " set with buffer of type " +
                                    renderDataTypeName(externalBuffer->getType()));

      // check multiple-set errors (duplicates in externalBuffers list?)
      if (a.buff) throw std::invalid_argument("attribute " + name + " is already set");

      // cast to the engine type (booooooo)
      std::shared_ptr<GLAttributeBuffer> engineExtBuff = std::dynamic_pointer_cast<GLAttributeBuffer>(externalBuffer);
      if (!engineExtBuff) throw std::invalid_argument("attribute " + name + " external buffer engine type cast failed");

      a.buff = engineExtBuff;

      a.buff->bind();

      assignBufferToVAO(a);
      return;
    }
  }

  throw std::invalid_argument("Tried to set nonexistent attribute with name " + name);
}